

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void SequenceTask_DemoLDF::my_update_example_indicies
               (search *sch,bool param_2,example *ec,uint64_t mult_amount,uint64_t plus_amount)

{
  byte *pbVar1;
  ulong *puVar2;
  size_t sVar3;
  byte *pbVar4;
  ulong *puVar5;
  example *__range1;
  
  sVar3 = Search::search::get_stride_shift(sch);
  pbVar1 = (ec->super_example_predict).indices._end;
  for (pbVar4 = (ec->super_example_predict).indices._begin; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    puVar2 = (ec->super_example_predict).feature_space[*pbVar4].indicies._end;
    for (puVar5 = (ec->super_example_predict).feature_space[*pbVar4].indicies._begin;
        puVar5 != puVar2; puVar5 = puVar5 + 1) {
      *puVar5 = (*puVar5 >> ((byte)sVar3 & 0x3f)) * mult_amount + plus_amount <<
                ((byte)sVar3 & 0x3f);
    }
  }
  return;
}

Assistant:

void my_update_example_indicies(
    Search::search& sch, bool /* audit */, example* ec, uint64_t mult_amount, uint64_t plus_amount)
{
  size_t ss = sch.get_stride_shift();
  for (features& fs : *ec)
    for (feature_index& idx : fs.indicies) idx = (((idx >> ss) * mult_amount) + plus_amount) << ss;
}